

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall simple_json::Stream::emit_json_key_object(Stream *this,string *key)

{
  bool local_d;
  Type local_c;
  
  emit_json_key(this,key);
  spirv_cross::StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"{\n");
  this->indent = this->indent + 1;
  local_c = Object;
  local_d = false;
  std::deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>::
  emplace_back<simple_json::Type,bool>
            ((deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>
              *)this,&local_c,&local_d);
  return;
}

Assistant:

void Stream::emit_json_key_object(const std::string &key)
{
	emit_json_key(key);
	statement_inner("{\n");
	++indent;
	stack.emplace(Type::Object, false);
}